

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_pagehandle.cc
# Opt level: O0

PF_PageHandle * __thiscall PF_PageHandle::operator=(PF_PageHandle *this,PF_PageHandle *pageHandle)

{
  PF_PageHandle *pageHandle_local;
  PF_PageHandle *this_local;
  
  if (this != pageHandle) {
    this->pageNum = pageHandle->pageNum;
    this->pPageData = pageHandle->pPageData;
  }
  return this;
}

Assistant:

PF_PageHandle& PF_PageHandle::operator= (const PF_PageHandle &pageHandle)
{
  // Check for self-assignment
  if (this != &pageHandle) {

    // Just copy the pointers since there is no local memory
    // allocation involved
    this->pageNum = pageHandle.pageNum;
    this->pPageData = pageHandle.pPageData;
  }

  // Return a reference to this
  return (*this);
}